

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall
mkvmuxer::Cluster::AddFrameWithDiscardPadding
          (Cluster *this,uint8_t *data,uint64_t length,int64_t discard_padding,uint64_t track_number
          ,uint64_t abs_timecode,bool is_key)

{
  bool bVar1;
  Frame frame;
  Frame local_98;
  
  Frame::Frame(&local_98);
  bVar1 = Frame::Init(&local_98,data,length);
  if (bVar1) {
    local_98.is_key_ = is_key;
    local_98.track_number_ = track_number;
    local_98.timestamp_ = abs_timecode;
    local_98.discard_padding_ = discard_padding;
    bVar1 = QueueOrWriteFrame(this,&local_98);
  }
  else {
    bVar1 = false;
  }
  Frame::~Frame(&local_98);
  return bVar1;
}

Assistant:

bool Cluster::AddFrameWithDiscardPadding(const uint8_t* data, uint64_t length,
                                         int64_t discard_padding,
                                         uint64_t track_number,
                                         uint64_t abs_timecode, bool is_key) {
  Frame frame;
  if (!frame.Init(data, length))
    return false;
  frame.set_discard_padding(discard_padding);
  frame.set_track_number(track_number);
  frame.set_timestamp(abs_timecode);
  frame.set_is_key(is_key);
  return QueueOrWriteFrame(&frame);
}